

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

unique_ptr<pbrt::BDPTIntegrator,_std::default_delete<pbrt::BDPTIntegrator>_> __thiscall
pbrt::BDPTIntegrator::Create
          (BDPTIntegrator *this,ParameterDictionary *parameters,CameraHandle *camera,
          SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  allocator<char> local_b0;
  bool visualizeWeights;
  bool visualizeStrategies;
  allocator<char> local_ad;
  int maxDepth;
  string lightStrategy;
  string local_88;
  SamplerHandle *local_68;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *local_60;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *local_58;
  bool regularize;
  
  local_68 = sampler;
  local_60 = (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)aggregate;
  local_58 = lights;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lightStrategy,"maxdepth",(allocator<char> *)&local_88);
  iVar3 = ParameterDictionary::GetOneInt(parameters,&lightStrategy,5);
  std::__cxx11::string::~string((string *)&lightStrategy);
  maxDepth = iVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lightStrategy,"visualizestrategies",(allocator<char> *)&local_88);
  bVar1 = ParameterDictionary::GetOneBool(parameters,&lightStrategy,false);
  std::__cxx11::string::~string((string *)&lightStrategy);
  visualizeStrategies = bVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lightStrategy,"visualizeweights",(allocator<char> *)&local_88);
  bVar2 = ParameterDictionary::GetOneBool(parameters,&lightStrategy,false);
  std::__cxx11::string::~string((string *)&lightStrategy);
  visualizeWeights = bVar2;
  if (bVar1) {
    if (iVar3 < 6) goto LAB_003fa6e8;
  }
  else if (!bVar2 || iVar3 < 6) goto LAB_003fa6e8;
  Warning(loc,"visualizestrategies/visualizeweights was enabled, limiting maxdepth to 5");
  maxDepth = 5;
LAB_003fa6e8:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"lightsampler",&local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&regularize,"power",&local_ad);
  ParameterDictionary::GetOneString(&lightStrategy,parameters,&local_88,(string *)&regularize);
  std::__cxx11::string::~string((string *)&regularize);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"regularize",&local_b0);
  bVar1 = ParameterDictionary::GetOneBool(parameters,&local_88,false);
  std::__cxx11::string::~string((string *)&local_88);
  regularize = bVar1;
  std::
  make_unique<pbrt::BDPTIntegrator,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,int&,bool&,bool&,std::__cxx11::string&,bool&>
            ((CameraHandle *)this,(SamplerHandle *)camera,(PrimitiveHandle *)local_68,local_60,
             (int *)local_58,(bool *)&maxDepth,&visualizeStrategies,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&visualizeWeights,
             (bool *)&lightStrategy);
  std::__cxx11::string::~string((string *)&lightStrategy);
  return (__uniq_ptr_data<pbrt::BDPTIntegrator,_std::default_delete<pbrt::BDPTIntegrator>,_true,_true>
          )(__uniq_ptr_data<pbrt::BDPTIntegrator,_std::default_delete<pbrt::BDPTIntegrator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<BDPTIntegrator> BDPTIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    bool visualizeStrategies = parameters.GetOneBool("visualizestrategies", false);
    bool visualizeWeights = parameters.GetOneBool("visualizeweights", false);

    if ((visualizeStrategies || visualizeWeights) && maxDepth > 5) {
        Warning(loc, "visualizestrategies/visualizeweights was enabled, limiting "
                     "maxdepth to 5");
        maxDepth = 5;
    }

    std::string lightStrategy = parameters.GetOneString("lightsampler", "power");
    bool regularize = parameters.GetOneBool("regularize", false);
    return std::make_unique<BDPTIntegrator>(camera, sampler, aggregate, lights, maxDepth,
                                            visualizeStrategies, visualizeWeights,
                                            lightStrategy, regularize);
}